

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall asl::Socket_::bind(Socket_ *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  Type TVar2;
  Type TVar3;
  socklen_t __len_00;
  sockaddr *__addr_00;
  char *pcVar4;
  Socket_ *extraout_RAX;
  undefined4 in_register_00000034;
  String local_68;
  int local_4c [5];
  undefined1 local_38 [8];
  InetAddress here;
  int port_local;
  String *ip_local;
  Socket_ *this_local;
  
  here._12_4_ = SUB84(__addr,0);
  if (((int)here._12_4_ < 0) || (0xffff < (int)here._12_4_)) {
    this->_error = 8;
    this_local._7_1_ = 0;
  }
  else {
    InetAddress::InetAddress
              ((InetAddress *)local_38,(String *)CONCAT44(in_register_00000034,__fd),here._12_4_);
    iVar1 = InetAddress::length((InetAddress *)local_38);
    if (iVar1 == 0) {
      this_local._7_1_ = 0;
    }
    else {
      TVar3 = this->_family;
      TVar2 = InetAddress::type((InetAddress *)local_38);
      init(this,(EVP_PKEY_CTX *)(ulong)(TVar3 != TVar2));
      TVar3 = InetAddress::type((InetAddress *)local_38);
      this->_family = TVar3;
      local_4c[0] = 1;
      setOption<int>(this,1,2,local_4c);
      iVar1 = *(int *)&(this->super_SmartObject_).field_0xc;
      __addr_00 = (sockaddr *)InetAddress::ptr((InetAddress *)local_38);
      __len_00 = InetAddress::length((InetAddress *)local_38);
      iVar1 = ::bind(iVar1,__addr_00,__len_00);
      if (iVar1 == 0) {
        this_local._7_1_ = 1;
      }
      else {
        InetAddress::toString(&local_68,(InetAddress *)local_38);
        pcVar4 = asl::String::operator*(&local_68);
        verbose_print("Can\'t bind to %s\n",pcVar4);
        asl::String::~String(&local_68);
        this->_error = 8;
        this_local._7_1_ = 0;
      }
    }
    local_4c[1] = 1;
    InetAddress::~InetAddress((InetAddress *)local_38);
    this = extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool Socket_::bind(const String& ip, int port)
{
	if (port < 0 || port > 65535)
	{
		_error = SOCKET_BAD_BIND;
		return false;
	}

	InetAddress here(ip, port);
	if (here.length() == 0)
		return false;

	init(_family != here.type());
	_family = here.type();
	setOption(SOL_SOCKET, SO_REUSEADDR, 1);

	if(::bind(_handle, (sockaddr*)here.ptr(), here.length()))
	{
		verbose_print("Can't bind to %s\n", *here.toString());
		_error = SOCKET_BAD_BIND;
		return false;
	}
	return true;
}